

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  vector<unsigned_short> *this_00;
  ushort uVar1;
  unsigned_long_long *puVar2;
  unsigned_short *puVar3;
  uint16 i;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint16 i_2;
  ulong uVar10;
  uint16 i_1;
  long lVar11;
  uint uVar12;
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  uint8 D6 [4096];
  elemental_vector local_1068;
  elemental_vector local_1058;
  vector<unsigned_short> *local_1048;
  crn_comp *local_1040;
  byte abStack_1038 [4104];
  
  this_00 = this->m_selector_remaping + 1;
  uVar1 = (ushort)(this->m_alpha_selectors).m_size;
  uVar4 = this->m_selector_remaping[1].m_size;
  uVar12 = (uint)uVar1;
  uVar7 = (uint)uVar1;
  if (uVar4 != uVar1) {
    if (uVar4 <= uVar1) {
      if (this->m_selector_remaping[1].m_capacity < uVar12) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar7,uVar4 + 1 == uVar12,2,(object_mover)0x0,false);
        uVar4 = this->m_selector_remaping[1].m_size;
      }
      memset(this_00->m_p + uVar4,0,(ulong)(uVar7 - uVar4) * 2);
    }
    this->m_selector_remaping[1].m_size = (uint)uVar1;
  }
  uVar5 = 0;
  do {
    abStack_1038[uVar5] =
         (&DAT_001b032b)[(uint)(uVar5 >> 3) & 7 ^ (uint)(uVar5 >> 9) & 0x7fffff] +
         (&DAT_001b032b)[((uint)(uVar5 >> 6) & 0x3ffffff ^ (uint)uVar5) & 7];
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x1000);
  local_1058.m_p = (void *)0x0;
  local_1058.m_size = 0;
  local_1058.m_capacity = 0;
  local_1048 = this_00;
  local_1040 = this;
  if (uVar1 == 0) {
    local_1068.m_p = (void *)0x0;
    local_1068.m_size = 0;
    local_1068.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_1058,uVar12,uVar12 == 1,8,(object_mover)0x0,false);
    memset((void *)((local_1058._8_8_ & 0xffffffff) * 8 + (long)local_1058.m_p),0,
           (ulong)(uVar12 - local_1058.m_size) << 3);
    local_1058.m_size = uVar12;
    local_1068.m_p = (void *)0x0;
    local_1068.m_size = 0;
    local_1068.m_capacity = 0;
    elemental_vector::increase_capacity(&local_1068,uVar12,uVar12 == 1,2,(object_mover)0x0,false);
    uVar5 = 0;
    memset((void *)((local_1068._8_8_ & 0xffffffff) * 2 + (long)local_1068.m_p),0,
           (ulong)(uVar12 - local_1068.m_size) * 2);
    local_1068.m_size = uVar12;
    puVar2 = (this->m_alpha_selectors).m_p;
    do {
      *(unsigned_long_long *)((long)local_1058.m_p + uVar5 * 8) = puVar2[uVar5];
      *(short *)((long)local_1068.m_p + uVar5 * 2) = (short)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (uVar12 != 0) {
    puVar3 = local_1048->m_p;
    uVar9 = (ulong)uVar7;
    uVar5 = 0;
    do {
      uVar4 = 0xffffffff;
      uVar10 = 0;
      uVar12 = 0;
      do {
        uVar6 = *(long *)((long)local_1058.m_p + uVar10 * 8) << 6;
        lVar11 = 8;
        uVar7 = 0;
        uVar8 = uVar5;
        do {
          uVar7 = uVar7 + abStack_1038[(uint)uVar8 & 0x3f | (uint)uVar6 & 0xfc0];
          uVar6 = uVar6 >> 6;
          uVar8 = uVar8 >> 6;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        if (uVar7 < uVar4) {
          uVar4 = uVar7;
          uVar12 = (uint)uVar10;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar9);
      uVar10 = (ulong)(uVar12 & 0xffff);
      uVar5 = *(ulong *)((long)local_1058.m_p + uVar10 * 8);
      puVar3[*(ushort *)((long)local_1068.m_p + uVar10 * 2)] = uVar1 - (short)uVar9;
      *(undefined8 *)((long)local_1058.m_p + uVar10 * 8) =
           *(undefined8 *)((long)local_1058.m_p + uVar9 * 8 + -8);
      *(undefined2 *)((long)local_1068.m_p + uVar10 * 2) =
           *(undefined2 *)((long)local_1068.m_p + uVar9 * 2 + -2);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pack_alpha_selectors(local_1040,&local_1040->m_packed_alpha_selectors,local_1048);
  if (local_1068.m_p != (void *)0x0) {
    crnlib_free(local_1068.m_p);
  }
  if (local_1058.m_p != (void *)0x0) {
    crnlib_free(local_1058.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors()
    {
        crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
        uint16 n = m_alpha_selectors.size();
        remapping.resize(n);

        uint8 d[] = { 0, 2, 3, 3, 5, 5, 4, 4 };

        uint8 D6[0x1000];
        for (uint16 i = 0; i < 0x1000; i++)
        {
            D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];
        }

        crnlib::vector<uint64> selectors(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            selectors[i] = m_alpha_selectors[i];
            indices[i] = i;
        }
        uint64 selected_selector = 0;
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                uint error = 0;
                for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
                {
                    error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
                }
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_selector = selectors[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            selectors[selected_index] = selectors[left];
            indices[selected_index] = indices[left];
        }

        pack_alpha_selectors(m_packed_alpha_selectors, remapping);
    }